

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_reporting.cc
# Opt level: O0

void gflags::HandleCommandLineHelpFlags(void)

{
  vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_> *this;
  pointer pbVar1;
  bool bVar2;
  ulong uVar3;
  char *pcVar4;
  pointer pCVar5;
  ostream *poVar6;
  string local_108;
  undefined1 local_e8 [8];
  string package;
  __normal_iterator<gflags::CommandLineFlagInfo_*,_std::vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>_>
  local_c0;
  __normal_iterator<const_gflags::CommandLineFlagInfo_*,_std::vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>_>
  local_b8;
  const_iterator flag;
  string last_package;
  vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_> flags;
  undefined1 local_58 [8];
  string restrict_;
  undefined1 local_28 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  substrings;
  char *progname;
  
  substrings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)ProgramInvocationShortName();
  HandleCommandLineCompletions();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_28);
  AppendPrognameStrings
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_28,
             (char *)substrings.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if ((fLB::FLAGS_helpshort & 1) != 0) {
    ShowUsageWithFlagsMatching
              ((char *)substrings.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_28);
    (*(code *)gflags_exitfunc)(1);
    return;
  }
  if (((fLB::FLAGS_help & 1) != 0) || ((fLB::FLAGS_helpfull & 1) != 0)) {
    ShowUsageWithFlagsRestrict
              ((char *)substrings.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,"");
    (*(code *)gflags_exitfunc)(1);
    return;
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &flags.
                    super__Vector_base<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,'/',
                   fLS::FLAGS_helpon_abi_cxx11_);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &flags.
                    super__Vector_base<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,".");
    std::__cxx11::string::~string
              ((string *)
               &flags.
                super__Vector_base<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pbVar1 = substrings.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pcVar4 = (char *)std::__cxx11::string::c_str();
    ShowUsageWithFlagsRestrict((char *)pbVar1,pcVar4);
    (*(code *)gflags_exitfunc)(1);
    return;
  }
  uVar3 = std::__cxx11::string::empty();
  pbVar1 = substrings.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  if ((uVar3 & 1) != 0) {
    if ((fLB::FLAGS_helppackage & 1) != 0) {
      this = (vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_> *)
             ((long)&last_package.field_2 + 8);
      std::vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>::vector
                (this);
      GetAllFlags(this);
      std::__cxx11::string::string((string *)&flag);
      local_c0._M_current =
           (CommandLineFlagInfo *)
           std::vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>::
           begin((vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>
                  *)((long)&last_package.field_2 + 8));
      __gnu_cxx::
      __normal_iterator<gflags::CommandLineFlagInfo_const*,std::vector<gflags::CommandLineFlagInfo,std::allocator<gflags::CommandLineFlagInfo>>>
      ::__normal_iterator<gflags::CommandLineFlagInfo*>
                ((__normal_iterator<gflags::CommandLineFlagInfo_const*,std::vector<gflags::CommandLineFlagInfo,std::allocator<gflags::CommandLineFlagInfo>>>
                  *)&local_b8,&local_c0);
      while( true ) {
        package.field_2._8_8_ =
             std::vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>
             ::end((vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>
                    *)((long)&last_package.field_2 + 8));
        bVar2 = __gnu_cxx::operator!=
                          (&local_b8,
                           (__normal_iterator<gflags::CommandLineFlagInfo_*,_std::vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>_>
                            *)((long)&package.field_2 + 8));
        if (!bVar2) break;
        pCVar5 = __gnu_cxx::
                 __normal_iterator<const_gflags::CommandLineFlagInfo_*,_std::vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>_>
                 ::operator->(&local_b8);
        bVar2 = FileMatchesSubstring
                          (&pCVar5->filename,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_28);
        if (bVar2) {
          pCVar5 = __gnu_cxx::
                   __normal_iterator<const_gflags::CommandLineFlagInfo_*,_std::vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>_>
                   ::operator->(&local_b8);
          Dirname(&local_108,&pCVar5->filename);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_e8,&local_108,'/');
          std::__cxx11::string::~string((string *)&local_108);
          bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_e8,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&flag);
          pbVar1 = substrings.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
          if (bVar2) {
            pcVar4 = (char *)std::__cxx11::string::c_str();
            ShowUsageWithFlagsRestrict((char *)pbVar1,pcVar4);
            uVar3 = std::__cxx11::string::empty();
            if ((uVar3 & 1) == 0) {
              poVar6 = std::operator<<((ostream *)&std::cerr,"Multiple packages contain a file=");
              std::operator<<(poVar6,(char *)substrings.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
            }
            std::__cxx11::string::operator=((string *)&flag,(string *)local_e8);
          }
          std::__cxx11::string::~string((string *)local_e8);
        }
        __gnu_cxx::
        __normal_iterator<const_gflags::CommandLineFlagInfo_*,_std::vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>_>
        ::operator++(&local_b8);
      }
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) != 0) {
        poVar6 = std::operator<<((ostream *)&std::cerr,"Unable to find a package for file=");
        std::operator<<(poVar6,(char *)substrings.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      (*(code *)gflags_exitfunc)(1);
      return;
    }
    if ((fLB::FLAGS_helpxml & 1) == 0) {
      if ((fLB::FLAGS_version & 1) == 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_28);
        return;
      }
      ShowVersion();
      (*(code *)gflags_exitfunc)(0);
      return;
    }
    ShowXMLOfFlags((char *)substrings.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
    (*(code *)gflags_exitfunc)(1);
    return;
  }
  pcVar4 = (char *)std::__cxx11::string::c_str();
  ShowUsageWithFlagsRestrict((char *)pbVar1,pcVar4);
  (*(code *)gflags_exitfunc)(1);
  return;
}

Assistant:

void HandleCommandLineHelpFlags() {
  const char* progname = ProgramInvocationShortName();

  HandleCommandLineCompletions();

  vector<string> substrings;
  AppendPrognameStrings(&substrings, progname);

  if (FLAGS_helpshort) {
    // show only flags related to this binary:
    // E.g. for fileutil.cc, want flags containing   ... "/fileutil." cc
    ShowUsageWithFlagsMatching(progname, substrings);
    gflags_exitfunc(1);

  } else if (FLAGS_help || FLAGS_helpfull) {
    // show all options
    ShowUsageWithFlagsRestrict(progname, "");   // empty restrict
    gflags_exitfunc(1);

  } else if (!FLAGS_helpon.empty()) {
    string restrict_ = PATH_SEPARATOR + FLAGS_helpon + ".";
    ShowUsageWithFlagsRestrict(progname, restrict_.c_str());
    gflags_exitfunc(1);

  } else if (!FLAGS_helpmatch.empty()) {
    ShowUsageWithFlagsRestrict(progname, FLAGS_helpmatch.c_str());
    gflags_exitfunc(1);

  } else if (FLAGS_helppackage) {
    // Shows help for all files in the same directory as main().  We
    // don't want to resort to looking at dirname(progname), because
    // the user can pick progname, and it may not relate to the file
    // where main() resides.  So instead, we search the flags for a
    // filename like "/progname.cc", and take the dirname of that.
    vector<CommandLineFlagInfo> flags;
    GetAllFlags(&flags);
    string last_package;
    for (vector<CommandLineFlagInfo>::const_iterator flag = flags.begin();
         flag != flags.end();
         ++flag) {
      if (!FileMatchesSubstring(flag->filename, substrings))
        continue;
      const string package = Dirname(flag->filename) + PATH_SEPARATOR;
      if (package != last_package) {
        ShowUsageWithFlagsRestrict(progname, package.c_str());
        VLOG(7) << "Found package: " << package;
        if (!last_package.empty()) {      // means this isn't our first pkg
          LOG(WARNING) << "Multiple packages contain a file=" << progname;
        }
        last_package = package;
      }
    }
    if (last_package.empty()) {   // never found a package to print
      LOG(WARNING) << "Unable to find a package for file=" << progname;
    }
    gflags_exitfunc(1);

  } else if (FLAGS_helpxml) {
    ShowXMLOfFlags(progname);
    gflags_exitfunc(1);

  } else if (FLAGS_version) {
    ShowVersion();
    // Unlike help, we may be asking for version in a script, so return 0
    gflags_exitfunc(0);

  }
}